

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

ArrayBufferDetachedStateBase * __thiscall
Js::ExternalArrayBuffer::CreateDetachedState
          (ExternalArrayBuffer *this,RefCountedBuffer *buffer,uint32 bufferLength)

{
  HeapAllocator *alloc;
  ArrayBufferDetachedStateBase *this_00;
  TrackAllocData local_48;
  uint32 local_1c;
  RefCountedBuffer *pRStack_18;
  uint32 bufferLength_local;
  RefCountedBuffer *buffer_local;
  ExternalArrayBuffer *this_local;
  
  local_1c = bufferLength;
  pRStack_18 = buffer;
  buffer_local = (RefCountedBuffer *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&ExternalArrayBufferDetachedState::typeinfo,0,0xffffffffffffffff
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
             ,0x4f2);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_00 = (ArrayBufferDetachedStateBase *)new<Memory::HeapAllocator>(0x20,alloc,0x350bd0);
  ExternalArrayBufferDetachedState::ExternalArrayBufferDetachedState
            ((ExternalArrayBufferDetachedState *)this_00,pRStack_18,local_1c);
  return this_00;
}

Assistant:

ArrayBufferDetachedStateBase* ExternalArrayBuffer::CreateDetachedState(RefCountedBuffer* buffer, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength)
    {
        return HeapNew(ExternalArrayBufferDetachedState, buffer, bufferLength);
    }